

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

void secp256k1_schnorrsig_sha256_tagged(secp256k1_sha256 *sha)

{
  secp256k1_sha256 *in_RDI;
  
  secp256k1_sha256_initialize(in_RDI);
  in_RDI->s[0] = 0x9cecba11;
  in_RDI->s[1] = 0x23925381;
  in_RDI->s[2] = 0x11679112;
  in_RDI->s[3] = 0xd1627e0f;
  in_RDI->s[4] = 0x97c87550;
  in_RDI->s[5] = 0x3cc765;
  in_RDI->s[6] = 0x90f61164;
  in_RDI->s[7] = 0x33e9b66a;
  in_RDI->bytes = 0x40;
  return;
}

Assistant:

static void secp256k1_schnorrsig_sha256_tagged(secp256k1_sha256 *sha) {
    secp256k1_sha256_initialize(sha);
    sha->s[0] = 0x9cecba11ul;
    sha->s[1] = 0x23925381ul;
    sha->s[2] = 0x11679112ul;
    sha->s[3] = 0xd1627e0ful;
    sha->s[4] = 0x97c87550ul;
    sha->s[5] = 0x003cc765ul;
    sha->s[6] = 0x90f61164ul;
    sha->s[7] = 0x33e9b66aul;
    sha->bytes = 64;
}